

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SySetGetNextEntry(SySet *pSet,void **ppEntry)

{
  uchar *zSrc;
  void **ppEntry_local;
  SySet *pSet_local;
  
  if (pSet->nCursor < pSet->nUsed) {
    if (ppEntry != (void **)0x0) {
      *ppEntry = (void *)((long)pSet->pBase + (ulong)(pSet->nCursor * pSet->eSize));
    }
    pSet->nCursor = pSet->nCursor + 1;
    pSet_local._4_4_ = 0;
  }
  else {
    pSet->nCursor = 0;
    pSet_local._4_4_ = -0x12;
  }
  return pSet_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SySetGetNextEntry(SySet *pSet, void **ppEntry)
{
	register unsigned char *zSrc;
	if( pSet->nCursor >= pSet->nUsed ){
		/* Reset cursor */
		pSet->nCursor = 0;
		return SXERR_EOF;
	}
	zSrc = (unsigned char *)SySetBasePtr(pSet);
	if( ppEntry ){
		*ppEntry = (void *)&zSrc[pSet->nCursor * pSet->eSize];
	}
	pSet->nCursor++;
	return SXRET_OK;
}